

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SDL_gpu_matrix.c
# Opt level: O1

void GPU_MatrixRotate(float *result,float degrees,float x,float y,float z)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float temp [16];
  float local_98;
  float local_94;
  float local_90;
  undefined4 local_8c;
  float local_88;
  float local_84;
  float local_80;
  undefined4 local_7c;
  float local_78;
  float local_74;
  float local_70;
  undefined8 local_6c;
  undefined8 uStack_64;
  undefined4 local_5c;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  undefined8 uStack_30;
  undefined8 local_28;
  undefined8 uStack_20;
  
  if (result != (float *)0x0) {
    fVar1 = z * z + x * x + y * y;
    if (fVar1 < 0.0) {
      fVar1 = sqrtf(fVar1);
    }
    else {
      fVar1 = SQRT(fVar1);
    }
    fVar1 = 1.0 / fVar1;
    fVar4 = x * fVar1;
    fVar6 = y * fVar1;
    fVar1 = fVar1 * z;
    fVar2 = cosf(degrees * 0.017453292);
    fVar3 = sinf(degrees * 0.017453292);
    fVar7 = 1.0 - fVar2;
    fVar5 = fVar1 * fVar7;
    local_88 = fVar4 * fVar6 * fVar7;
    local_98 = fVar4 * fVar4 * fVar7 + fVar2;
    local_94 = fVar3 * fVar1 + local_88;
    local_90 = fVar4 * fVar5 - fVar6 * fVar3;
    local_8c = 0;
    local_88 = local_88 - fVar3 * fVar1;
    local_84 = fVar6 * fVar7 * fVar6 + fVar2;
    local_80 = fVar4 * fVar3 + fVar6 * fVar5;
    local_7c = 0;
    local_78 = fVar6 * fVar3 + fVar4 * fVar5;
    local_74 = fVar6 * fVar5 - fVar4 * fVar3;
    local_70 = fVar5 * fVar1 + fVar2;
    local_6c = 0;
    uStack_64 = 0;
    local_5c = 0x3f800000;
    GPU_MatrixMultiply((float *)&local_58,result,&local_98);
    *(undefined8 *)(result + 0xc) = local_28;
    *(undefined8 *)(result + 0xe) = uStack_20;
    *(undefined8 *)(result + 8) = local_38;
    *(undefined8 *)(result + 10) = uStack_30;
    *(undefined8 *)(result + 4) = local_48;
    *(undefined8 *)(result + 6) = uStack_40;
    *(undefined8 *)result = local_58;
    *(undefined8 *)(result + 2) = uStack_50;
  }
  return;
}

Assistant:

void GPU_MatrixRotate(float* result, float degrees, float x, float y, float z)
{
	float p, radians, c, s, c_, zc_, yc_, xzc_, xyc_, yzc_, xs, ys, zs;

    if(result == NULL)
		return;

    p = 1/sqrtf(x*x + y*y + z*z);
    x *= p; y *= p; z *= p;
    radians = degrees * RAD_PER_DEG;
    c = cosf(radians);
    s = sinf(radians);
    c_ = 1 - c;
    zc_ = z*c_;
    yc_ = y*c_;
    xzc_ = x*zc_;
    xyc_ = x*y*c_;
    yzc_ = y*zc_;
    xs = x*s;
    ys = y*s;
    zs = z*s;

	{
#ifdef ROW_MAJOR
		float A[16];
		FILL_MATRIX_4x4(A,
				x*x*c_ + c,  xyc_ - zs,   xzc_ + ys, 0,
				xyc_ + zs,   y*yc_ + c,   yzc_ - xs, 0,
				xzc_ - ys,   yzc_ + xs,   z*zc_ + c, 0,
				0,           0,           0,         1
			);
#else
		float A[16];
		FILL_MATRIX_4x4(A,
				x*x*c_ + c, xyc_ + zs, xzc_ - ys, 0,
				xyc_ - zs, y*yc_ + c, yzc_ + xs, 0,
				xzc_ + ys, yzc_ - xs, z*zc_ + c, 0,
				0, 0, 0, 1
			);
#endif

		GPU_MultiplyAndAssign(result, A);
	}
}